

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PathUtil.cpp
# Opt level: O0

string * opencollada::Path::RemoveDotSegments(string *path)

{
  byte bVar1;
  bool bVar2;
  undefined1 uVar3;
  __type _Var4;
  char *pcVar5;
  string *in_RSI;
  string *in_RDI;
  size_t end;
  size_t begin;
  size_t slash_pos_1;
  size_t slash_pos;
  string input;
  string *output;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *in_stack_fffffffffffffea8;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *in_stack_fffffffffffffeb0;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *in_stack_fffffffffffffeb8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffec8;
  undefined7 in_stack_fffffffffffffed0;
  string *in_stack_fffffffffffffed8;
  undefined7 in_stack_fffffffffffffee0;
  undefined1 in_stack_fffffffffffffee7;
  string local_e8 [32];
  undefined8 local_c8;
  long local_c0;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *local_b8;
  undefined8 local_b0;
  undefined8 local_a8;
  undefined8 local_a0;
  char *local_98;
  undefined8 local_90;
  long local_88;
  string *local_80;
  undefined8 local_78;
  undefined8 local_70;
  undefined8 local_68;
  char *local_60;
  undefined8 local_58;
  long local_50;
  undefined1 local_31;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_30 [6];
  
  ::std::__cxx11::string::string((string *)local_30,in_RSI);
  local_31 = 0;
  ::std::__cxx11::string::string((string *)in_RDI);
  ::std::__cxx11::string::length();
  ::std::__cxx11::string::reserve((ulong)in_RDI);
  while (bVar1 = ::std::__cxx11::string::empty(), ((bVar1 ^ 0xff) & 1) != 0) {
    bVar2 = String::StartsWith((string *)
                               CONCAT17(in_stack_fffffffffffffee7,in_stack_fffffffffffffee0),
                               in_stack_fffffffffffffed8);
    if (bVar2) {
      ::std::__cxx11::string::erase((ulong)local_30,0);
    }
    else {
      bVar2 = String::StartsWith((string *)
                                 CONCAT17(in_stack_fffffffffffffee7,in_stack_fffffffffffffee0),
                                 in_stack_fffffffffffffed8);
      if (bVar2) {
        ::std::__cxx11::string::erase((ulong)local_30,0);
      }
      else {
        bVar2 = String::StartsWith((string *)
                                   CONCAT17(in_stack_fffffffffffffee7,in_stack_fffffffffffffee0),
                                   in_stack_fffffffffffffed8);
        if (bVar2) {
          ::std::__cxx11::string::replace((ulong)local_30,0,slash_dot_slash_len);
        }
        else {
          bVar2 = String::StartsWith((string *)
                                     CONCAT17(in_stack_fffffffffffffee7,in_stack_fffffffffffffee0),
                                     in_stack_fffffffffffffed8);
          if ((bVar2) &&
             ((pcVar5 = (char *)::std::__cxx11::string::operator[]((ulong)local_30), *pcVar5 == '/'
              || (pcVar5 = (char *)::std::__cxx11::string::operator[]((ulong)local_30),
                 *pcVar5 == '\0')))) {
            ::std::__cxx11::string::replace((ulong)local_30,0,slash_dot_len);
          }
          else {
            in_stack_fffffffffffffee7 =
                 String::StartsWith((string *)
                                    CONCAT17(in_stack_fffffffffffffee7,in_stack_fffffffffffffee0),
                                    in_stack_fffffffffffffed8);
            if ((bool)in_stack_fffffffffffffee7) {
              ::std::__cxx11::string::replace((ulong)local_30,0,slash_dot_dot_slash_len);
              local_50 = ::std::__cxx11::string::rfind((char)in_RDI,0x2f);
              if (local_50 == -1) {
                ::std::__cxx11::string::clear();
              }
              else {
                local_68 = ::std::__cxx11::string::begin();
                local_60 = (char *)__gnu_cxx::
                                   __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                   ::operator+(in_stack_fffffffffffffeb8,
                                               (difference_type)in_stack_fffffffffffffeb0);
                __gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>::
                __normal_iterator<char*>(in_stack_fffffffffffffeb0,in_stack_fffffffffffffea8);
                local_78 = ::std::__cxx11::string::end();
                __gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>::
                __normal_iterator<char*>(in_stack_fffffffffffffeb0,in_stack_fffffffffffffea8);
                in_stack_fffffffffffffed8 =
                     (string *)::std::__cxx11::string::erase(in_RDI,local_58,local_70);
                local_80 = in_stack_fffffffffffffed8;
              }
            }
            else {
              uVar3 = String::StartsWith((string *)
                                         CONCAT17(in_stack_fffffffffffffee7,
                                                  in_stack_fffffffffffffee0),
                                         in_stack_fffffffffffffed8);
              if (((bool)uVar3) &&
                 ((in_stack_fffffffffffffec8 =
                        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        ::std::__cxx11::string::operator[]((ulong)local_30),
                  in_stack_fffffffffffffec8->_M_dataplus == (_Alloc_hider)0x2f ||
                  (pcVar5 = (char *)::std::__cxx11::string::operator[]((ulong)local_30),
                  *pcVar5 == '\0')))) {
                ::std::__cxx11::string::replace((ulong)local_30,0,slash_dot_dot_len);
                local_88 = ::std::__cxx11::string::rfind((char)in_RDI,0x2f);
                if (local_88 == -1) {
                  ::std::__cxx11::string::clear();
                }
                else {
                  local_a0 = ::std::__cxx11::string::begin();
                  local_98 = (char *)__gnu_cxx::
                                     __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                     ::operator+(in_stack_fffffffffffffeb8,
                                                 (difference_type)in_stack_fffffffffffffeb0);
                  __gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>::
                  __normal_iterator<char*>(in_stack_fffffffffffffeb0,in_stack_fffffffffffffea8);
                  local_b0 = ::std::__cxx11::string::end();
                  __gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>::
                  __normal_iterator<char*>(in_stack_fffffffffffffeb0,in_stack_fffffffffffffea8);
                  in_stack_fffffffffffffeb8 =
                       (__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)::std::__cxx11::string::erase(in_RDI,local_90,local_a8);
                  local_b8 = in_stack_fffffffffffffeb8;
                }
              }
              else {
                _Var4 = ::std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                           *)CONCAT17(uVar3,in_stack_fffffffffffffed0),
                                          in_stack_fffffffffffffec8);
                if ((_Var4) ||
                   (_Var4 = ::std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                               *)CONCAT17(uVar3,in_stack_fffffffffffffed0),
                                              in_stack_fffffffffffffec8), _Var4)) {
                  ::std::__cxx11::string::clear();
                }
                else {
                  local_c0 = ::std::__cxx11::string::find((char)local_30,0x2f);
                  if (local_c0 == 0) {
                    local_c0 = 0;
                  }
                  in_stack_fffffffffffffeb0 = local_30;
                  local_c8 = ::std::__cxx11::string::find((char)in_stack_fffffffffffffeb0,0x2f);
                  ::std::__cxx11::string::substr((ulong)local_e8,(ulong)in_stack_fffffffffffffeb0);
                  ::std::__cxx11::string::append((string *)in_RDI);
                  ::std::__cxx11::string::~string(local_e8);
                  ::std::__cxx11::string::erase((ulong)local_30,0);
                }
              }
            }
          }
        }
      }
    }
  }
  local_31 = 1;
  ::std::__cxx11::string::~string((string *)local_30);
  return in_RDI;
}

Assistant:

string Path::RemoveDotSegments(const string & path)
	{
		string input = path;
		string output;
		output.reserve(input.length());

#if defined(_WIN32)
		bool contains_anti_slash = String::Replace(input, '\\', '/') > 0;
#endif

		while (!input.empty())
		{
			if (String::StartsWith(input, dot_dot_slash))
			{
				input.erase(0, dot_dot_slash_len);
			}
			else if (String::StartsWith(input, dot_slash))
			{
				input.erase(0, dot_slash_len);
			}
			else if (String::StartsWith(input, slash_dot_slash))
			{
				input.replace(0, slash_dot_slash_len, "/");
			}
			else if (String::StartsWith(input, slash_dot) &&
				(input[slash_dot_len] == '/' || input[slash_dot_len] == '\0'))
			{
				input.replace(0, slash_dot_len, "/");
			}
			else if (String::StartsWith(input, slash_dot_dot_slash))
			{
				input.replace(0, slash_dot_dot_slash_len, "/");
				size_t slash_pos = output.rfind('/');
				if (slash_pos == string::npos)
					output.clear();
				else
					output.erase(output.begin() + static_cast<ptrdiff_t>(slash_pos), output.end());
			}
			else if (String::StartsWith(input, slash_dot_dot) &&
				(input[slash_dot_dot_len] == '/' || input[slash_dot_dot_len] == '\0'))
			{
				input.replace(0, slash_dot_dot_len, "/");
				size_t slash_pos = output.rfind('/');
				if (slash_pos == string::npos)
					output.clear();
				else
					output.erase(output.begin() + static_cast<ptrdiff_t>(slash_pos), output.end());
			}
			else if (input == dot || input == dot_dot)
			{
				input.clear();
			}
			else
			{
				size_t begin = input.find('/');
				if (begin == 0)
					begin = 0;
				size_t end = input.find('/', 1);
				output.append(input.substr(0, end));
				input.erase(0, end);
			}
		}

#if defined(_WIN32)
		if (contains_anti_slash)
			String::Replace(output, '/', '\\');
#endif

		return output;
	}